

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraCodeLiteGenerator::CreateProjectSourceEntries
          (cmExtraCodeLiteGenerator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          *cFiles,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *otherFiles,cmXMLWriter *_xml,string *projectPath,cmMakefile *mf,
          string *projectType,string *targetName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  string *psVar6;
  char *this_00;
  cmExtraCodeLiteGenerator *pcVar7;
  string outputPath;
  string relapath;
  string codeliteCompilerName;
  SystemInformation info;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  SystemInformation local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  FindMatchingHeaderfiles(this,cFiles,otherFiles);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"VirtualDirectory","");
  cmXMLWriter::StartElement(_xml,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = (cmExtraCodeLiteGenerator *)_xml;
  cmXMLWriter::Attribute<char[4]>(_xml,"Name",(char (*) [4])0x7f99ab);
  CreateFoldersAndFiles(pcVar7,cFiles,_xml,projectPath);
  cmXMLWriter::EndElement(_xml);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"VirtualDirectory","");
  cmXMLWriter::StartElement(_xml,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = (cmExtraCodeLiteGenerator *)_xml;
  cmXMLWriter::Attribute<char[8]>(_xml,"Name",(char (*) [8])0x7ffb66);
  CreateFoldersAndFiles(pcVar7,otherFiles,_xml,projectPath);
  cmXMLWriter::EndElement(_xml);
  cmsys::SystemInformation::SystemInformation(&local_40);
  cmsys::SystemInformation::RunCPUCheck(&local_40);
  uVar4 = cmsys::SystemInformation::GetNumberOfLogicalCPU(&local_40);
  uVar5 = cmsys::SystemInformation::GetNumberOfPhysicalCPU(&local_40);
  this->CpuCount = uVar5 * uVar4;
  GetCodeLiteCompilerName_abi_cxx11_(&local_80,this,mf);
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Settings","");
  cmXMLWriter::StartElement(_xml,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"Type",projectType);
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Configuration","");
  cmXMLWriter::StartElement(_xml,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"Name",&this->ConfigName);
  GetCodeLiteCompilerName_abi_cxx11_(&local_c0,this,mf);
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"CompilerType",&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[17]>(_xml,"DebuggerType",(char (*) [17])"GNU gdb debugger");
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"Type",projectType);
  cmXMLWriter::Attribute<char[7]>(_xml,"BuildCmpWithGlobalSettings",(char (*) [7])0x7d9397);
  cmXMLWriter::Attribute<char[7]>(_xml,"BuildLnkWithGlobalSettings",(char (*) [7])0x7d9397);
  cmXMLWriter::Attribute<char[7]>(_xml,"BuildResWithGlobalSettings",(char (*) [7])0x7d9397);
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Compiler","");
  cmXMLWriter::StartElement(_xml,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[3]>(_xml,"Options",(char (*) [3])"-g");
  cmXMLWriter::Attribute<char[4]>(_xml,"Required",(char (*) [4])"yes");
  cmXMLWriter::Attribute<char[1]>(_xml,"PreCompiledHeader",(char (*) [1])0x84ab39);
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"IncludePath","");
  cmXMLWriter::StartElement(_xml,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[2]>(_xml,"Value",(char (*) [2])0x81f2f4);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Linker","");
  cmXMLWriter::StartElement(_xml,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x84ab39);
  cmXMLWriter::Attribute<char[4]>(_xml,"Required",(char (*) [4])"yes");
  cmXMLWriter::EndElement(_xml);
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"ResourceCompiler","");
  cmXMLWriter::StartElement(_xml,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x84ab39);
  cmXMLWriter::Attribute<char[3]>(_xml,"Required",(char (*) [3])0x849c4a);
  cmXMLWriter::EndElement(_xml);
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"General","");
  cmXMLWriter::StartElement(_xml,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_a0._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"CMAKE_RUNTIME_OUTPUT_DIRECTORY","");
  psVar6 = cmMakefile::GetSafeDefinition(mf,&local_a0);
  pcVar3 = (psVar6->_M_dataplus)._M_p;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar3,pcVar3 + psVar6->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  if (local_c0._M_string_length == 0) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a0._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"EXECUTABLE_OUTPUT_PATH","")
    ;
    cmMakefile::GetSafeDefinition(mf,&local_a0);
    std::__cxx11::string::_M_assign((string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    if (local_c0._M_string_length == 0) {
      cmXMLWriter::Attribute<char[40]>
                (_xml,"OutputFile",(char (*) [40])"$(IntermediateDirectory)/$(ProjectName)");
      goto LAB_00436ee6;
    }
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_string_length = 0;
  cmSystemTools::RelativePath(&local_e0,projectPath,&local_c0);
  std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_e0);
  paVar1 = &local_e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"OutputFile",&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
LAB_00436ee6:
  cmXMLWriter::Attribute<char[3]>(_xml,"IntermediateDirectory",(char (*) [3])0x7cb26a);
  cmXMLWriter::Attribute<char[17]>(_xml,"Command",(char (*) [17])"./$(ProjectName)");
  cmXMLWriter::Attribute<char[1]>(_xml,"CommandArguments",(char (*) [1])0x84ab39);
  if (local_c0._M_string_length == 0) {
    cmXMLWriter::Attribute<char[25]>
              (_xml,"WorkingDirectory",(char (*) [25])"$(IntermediateDirectory)");
  }
  else {
    cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"WorkingDirectory",&local_a0);
  }
  cmXMLWriter::Attribute<char[4]>(_xml,"PauseExecWhenProcTerminates",(char (*) [4])"yes");
  cmXMLWriter::EndElement(_xml);
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Debugger","");
  cmXMLWriter::StartElement(_xml,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[3]>(_xml,"IsRemote",(char (*) [3])0x849c4a);
  cmXMLWriter::Attribute<char[1]>(_xml,"RemoteHostName",(char (*) [1])0x84ab39);
  cmXMLWriter::Attribute<char[1]>(_xml,"RemoteHostPort",(char (*) [1])0x84ab39);
  cmXMLWriter::Attribute<char[1]>(_xml,"DebuggerPath",(char (*) [1])0x84ab39);
  cmXMLWriter::Element(_xml,"PostConnectCommands");
  cmXMLWriter::Element(_xml,"StartupCommands");
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::Element(_xml,"PreBuild");
  cmXMLWriter::Element(_xml,"PostBuild");
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"CustomBuild","");
  cmXMLWriter::StartElement(_xml,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[4]>(_xml,"Enabled",(char (*) [4])"yes");
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"RebuildCommand","");
  GetRebuildCommand(&local_60,this,mf,targetName);
  cmXMLWriter::StartElement(_xml,&local_e0);
  cmXMLWriter::Content<std::__cxx11::string>(_xml,&local_60);
  cmXMLWriter::EndElement(_xml);
  paVar2 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"CleanCommand","");
  GetCleanCommand(&local_60,this,mf,targetName);
  cmXMLWriter::StartElement(_xml,&local_e0);
  cmXMLWriter::Content<std::__cxx11::string>(_xml,&local_60);
  cmXMLWriter::EndElement(_xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"BuildCommand","");
  GetBuildCommand(&local_60,this,mf,targetName);
  cmXMLWriter::StartElement(_xml,&local_e0);
  cmXMLWriter::Content<std::__cxx11::string>(_xml,&local_60);
  cmXMLWriter::EndElement(_xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  this_00 = "SingleFileCommand";
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"SingleFileCommand","");
  GetSingleFileBuildCommand_abi_cxx11_(&local_60,(cmExtraCodeLiteGenerator *)this_00,mf);
  cmXMLWriter::StartElement(_xml,&local_e0);
  cmXMLWriter::Content<std::__cxx11::string>(_xml,&local_60);
  cmXMLWriter::EndElement(_xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Element(_xml,"PreprocessFileCommand");
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"WorkingDirectory","");
  cmXMLWriter::StartElement(_xml,&local_e0);
  cmXMLWriter::Content<char[17]>(_xml,(char (*) [17])"$(WorkspacePath)");
  cmXMLWriter::EndElement(_xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::EndElement(_xml);
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"AdditionalRules","");
  cmXMLWriter::StartElement(_xml,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Element(_xml,"CustomPostBuild");
  cmXMLWriter::Element(_xml,"CustomPreBuild");
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"GlobalSettings","");
  cmXMLWriter::StartElement(_xml,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Compiler","");
  cmXMLWriter::StartElement(_xml,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x84ab39);
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"IncludePath","");
  cmXMLWriter::StartElement(_xml,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[2]>(_xml,"Value",(char (*) [2])0x81f2f4);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Linker","");
  cmXMLWriter::StartElement(_xml,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x84ab39);
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"LibraryPath","");
  cmXMLWriter::StartElement(_xml,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[2]>(_xml,"Value",(char (*) [2])0x81f2f4);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ResourceCompiler","");
  cmXMLWriter::StartElement(_xml,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x84ab39);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != local_38) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemInformation::~SystemInformation(&local_40);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateProjectSourceEntries(
  std::map<std::string, cmSourceFile*>& cFiles,
  std::set<std::string>& otherFiles, cmXMLWriter* _xml,
  const std::string& projectPath, const cmMakefile* mf,
  const std::string& projectType, const std::string& targetName)
{
  cmXMLWriter& xml(*_xml);
  this->FindMatchingHeaderfiles(cFiles, otherFiles);
  // Create 2 virtual folders: src and include
  // and place all the implementation files into the src
  // folder, the rest goes to the include folder
  xml.StartElement("VirtualDirectory");
  xml.Attribute("Name", "src");

  // insert all source files in the codelite project
  // first the C/C++ implementation files, then all others
  this->CreateFoldersAndFiles(cFiles, xml, projectPath);
  xml.EndElement(); // VirtualDirectory

  xml.StartElement("VirtualDirectory");
  xml.Attribute("Name", "include");
  this->CreateFoldersAndFiles(otherFiles, xml, projectPath);
  xml.EndElement(); // VirtualDirectory

  // Get the number of CPUs. We use this information for the make -jN
  // command
  cmsys::SystemInformation info;
  info.RunCPUCheck();

  this->CpuCount =
    info.GetNumberOfLogicalCPU() * info.GetNumberOfPhysicalCPU();

  std::string codeliteCompilerName = this->GetCodeLiteCompilerName(mf);

  xml.StartElement("Settings");
  xml.Attribute("Type", projectType);

  xml.StartElement("Configuration");
  xml.Attribute("Name", this->ConfigName);
  xml.Attribute("CompilerType", this->GetCodeLiteCompilerName(mf));
  xml.Attribute("DebuggerType", "GNU gdb debugger");
  xml.Attribute("Type", projectType);
  xml.Attribute("BuildCmpWithGlobalSettings", "append");
  xml.Attribute("BuildLnkWithGlobalSettings", "append");
  xml.Attribute("BuildResWithGlobalSettings", "append");

  xml.StartElement("Compiler");
  xml.Attribute("Options", "-g");
  xml.Attribute("Required", "yes");
  xml.Attribute("PreCompiledHeader", "");
  xml.StartElement("IncludePath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // IncludePath
  xml.EndElement(); // Compiler

  xml.StartElement("Linker");
  xml.Attribute("Options", "");
  xml.Attribute("Required", "yes");
  xml.EndElement(); // Linker

  xml.StartElement("ResourceCompiler");
  xml.Attribute("Options", "");
  xml.Attribute("Required", "no");
  xml.EndElement(); // ResourceCompiler

  xml.StartElement("General");
  std::string outputPath =
    mf->GetSafeDefinition("CMAKE_RUNTIME_OUTPUT_DIRECTORY");
  if (outputPath.empty()) {
    outputPath = mf->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  }
  std::string relapath;
  if (!outputPath.empty()) {
    relapath = cmSystemTools::RelativePath(projectPath, outputPath);
    xml.Attribute("OutputFile", relapath + "/$(ProjectName)");
  } else {
    xml.Attribute("OutputFile", "$(IntermediateDirectory)/$(ProjectName)");
  }
  xml.Attribute("IntermediateDirectory", "./");
  xml.Attribute("Command", "./$(ProjectName)");
  xml.Attribute("CommandArguments", "");
  if (!outputPath.empty()) {
    xml.Attribute("WorkingDirectory", relapath);
  } else {
    xml.Attribute("WorkingDirectory", "$(IntermediateDirectory)");
  }
  xml.Attribute("PauseExecWhenProcTerminates", "yes");
  xml.EndElement(); // General

  xml.StartElement("Debugger");
  xml.Attribute("IsRemote", "no");
  xml.Attribute("RemoteHostName", "");
  xml.Attribute("RemoteHostPort", "");
  xml.Attribute("DebuggerPath", "");
  xml.Element("PostConnectCommands");
  xml.Element("StartupCommands");
  xml.EndElement(); // Debugger

  xml.Element("PreBuild");
  xml.Element("PostBuild");

  xml.StartElement("CustomBuild");
  xml.Attribute("Enabled", "yes");
  xml.Element("RebuildCommand", this->GetRebuildCommand(mf, targetName));
  xml.Element("CleanCommand", this->GetCleanCommand(mf, targetName));
  xml.Element("BuildCommand", this->GetBuildCommand(mf, targetName));
  xml.Element("SingleFileCommand", this->GetSingleFileBuildCommand(mf));
  xml.Element("PreprocessFileCommand");
  xml.Element("WorkingDirectory", "$(WorkspacePath)");
  xml.EndElement(); // CustomBuild

  xml.StartElement("AdditionalRules");
  xml.Element("CustomPostBuild");
  xml.Element("CustomPreBuild");
  xml.EndElement(); // AdditionalRules

  xml.EndElement(); // Configuration
  xml.StartElement("GlobalSettings");

  xml.StartElement("Compiler");
  xml.Attribute("Options", "");
  xml.StartElement("IncludePath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // IncludePath
  xml.EndElement(); // Compiler

  xml.StartElement("Linker");
  xml.Attribute("Options", "");
  xml.StartElement("LibraryPath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // LibraryPath
  xml.EndElement(); // Linker

  xml.StartElement("ResourceCompiler");
  xml.Attribute("Options", "");
  xml.EndElement(); // ResourceCompiler

  xml.EndElement(); // GlobalSettings
  xml.EndElement(); // Settings
}